

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_inet_url(ngx_pool_t *pool,ngx_url_t *u)

{
  undefined8 uVar1;
  uint16_t uVar2;
  in_addr_t iVar3;
  u_char *puVar4;
  ngx_int_t nVar5;
  size_t len_00;
  ngx_addr_t *pnVar6;
  sockaddr *psVar7;
  u_char *puVar8;
  bool bVar9;
  in6_addr *__a;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  ngx_int_t n;
  size_t len;
  u_char *args;
  u_char *uri;
  u_char *last;
  u_char *port;
  u_char *host;
  u_char *p;
  ngx_url_t *u_local;
  ngx_pool_t *pool_local;
  
  u->socklen = 0x10;
  (u->sockaddr).sockaddr.sa_family = 2;
  u->family = 2;
  puVar8 = (u->url).data;
  uri = puVar8 + (u->url).len;
  last = ngx_strlchr(puVar8,uri,':');
  args = ngx_strlchr(puVar8,uri,'/');
  puVar4 = ngx_strlchr(puVar8,uri,'?');
  if ((puVar4 != (u_char *)0x0) && ((args == (u_char *)0x0 || (puVar4 < args)))) {
    args = puVar4;
  }
  if (args != (u_char *)0x0) {
    if (((u->field_0x48 & 1) != 0) || (((byte)u->field_0x48 >> 1 & 1) == 0)) {
      u->err = "invalid host";
      return -1;
    }
    (u->uri).len = (long)uri - (long)args;
    (u->uri).data = args;
    uri = args;
    if (args < last) {
      last = (u_char *)0x0;
    }
  }
  if (last == (u_char *)0x0) {
    if (((args == (u_char *)0x0) && ((u->field_0x48 & 1) != 0)) &&
       (nVar5 = ngx_atoi(puVar8,(long)uri - (long)puVar8), nVar5 != -1)) {
      if ((0 < nVar5) && (nVar5 < 0x10000)) {
        u->port = (uint16_t)nVar5;
        uVar2 = htons((uint16_t)nVar5);
        (u->sockaddr).sockaddr_in.sin_port = uVar2;
        (u->port_text).len = (long)uri - (long)puVar8;
        (u->port_text).data = puVar8;
        u->field_0x48 = u->field_0x48 & 0xef | 0x10;
        return 0;
      }
      u->err = "invalid port";
      return -1;
    }
    u->field_0x48 = u->field_0x48 & 0xf7 | 8;
    u->port = u->default_port;
    uVar2 = htons(u->default_port);
    (u->sockaddr).sockaddr_in.sin_port = uVar2;
  }
  else {
    puVar4 = last + 1;
    nVar5 = ngx_atoi(puVar4,(long)uri - (long)puVar4);
    if ((nVar5 < 1) || (0xffff < nVar5)) {
      u->err = "invalid port";
      return -1;
    }
    u->port = (uint16_t)nVar5;
    uVar2 = htons((uint16_t)nVar5);
    (u->sockaddr).sockaddr_in.sin_port = uVar2;
    (u->port_text).len = (long)uri - (long)puVar4;
    (u->port_text).data = puVar4;
    uri = last;
  }
  len_00 = (long)uri - (long)puVar8;
  if (len_00 == 0) {
    u->err = "no host";
    pool_local = (ngx_pool_t *)0xffffffffffffffff;
  }
  else {
    (u->host).len = len_00;
    (u->host).data = puVar8;
    if ((((u->field_0x48 & 1) == 0) || (len_00 != 1)) || (*puVar8 != '*')) {
      iVar3 = ngx_inet_addr(puVar8,len_00);
      (u->sockaddr).sockaddr_in6.sin6_flowinfo = iVar3;
      if ((u->sockaddr).sockaddr_in6.sin6_flowinfo == 0xffffffff) {
        if (((byte)u->field_0x48 >> 2 & 1) == 0) {
          nVar5 = ngx_inet_resolve_host(pool,u);
          if (nVar5 == 0) {
            u->family = (uint)u->addrs->sockaddr->sa_family;
            u->socklen = u->addrs->socklen;
            memcpy(&u->sockaddr,u->addrs->sockaddr,(ulong)u->addrs->socklen);
            if (u->family == 10) {
              bVar9 = false;
              if (((*(int *)((long)&u->sockaddr + 8) == 0) &&
                  (bVar9 = false, *(int *)((long)&u->sockaddr + 0xc) == 0)) &&
                 (bVar9 = false, *(int *)((long)&u->sockaddr + 0x10) == 0)) {
                bVar9 = *(int *)((long)&u->sockaddr + 0x14) == 0;
              }
              if (bVar9) {
                u->field_0x48 = u->field_0x48 & 0xef | 0x10;
              }
            }
            else if ((u->sockaddr).sockaddr_in6.sin6_flowinfo == 0) {
              u->field_0x48 = u->field_0x48 & 0xef | 0x10;
            }
            pool_local = (ngx_pool_t *)0x0;
          }
          else {
            pool_local = (ngx_pool_t *)0xffffffffffffffff;
          }
        }
        else {
          pool_local = (ngx_pool_t *)0x0;
        }
      }
      else {
        if ((u->sockaddr).sockaddr_in6.sin6_flowinfo == 0) {
          u->field_0x48 = u->field_0x48 & 0xef | 0x10;
        }
        u->naddrs = 1;
        pnVar6 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
        u->addrs = pnVar6;
        if (u->addrs == (ngx_addr_t *)0x0) {
          pool_local = (ngx_pool_t *)0xffffffffffffffff;
        }
        else {
          psVar7 = (sockaddr *)ngx_pcalloc(pool,0x10);
          if (psVar7 == (sockaddr *)0x0) {
            pool_local = (ngx_pool_t *)0xffffffffffffffff;
          }
          else {
            uVar1 = *(undefined8 *)&u->sockaddr;
            psVar7->sa_family = (short)uVar1;
            psVar7->sa_data[0] = (char)((ulong)uVar1 >> 0x10);
            psVar7->sa_data[1] = (char)((ulong)uVar1 >> 0x18);
            psVar7->sa_data[2] = (char)((ulong)uVar1 >> 0x20);
            psVar7->sa_data[3] = (char)((ulong)uVar1 >> 0x28);
            psVar7->sa_data[4] = (char)((ulong)uVar1 >> 0x30);
            psVar7->sa_data[5] = (char)((ulong)uVar1 >> 0x38);
            *(undefined8 *)(psVar7->sa_data + 6) = *(undefined8 *)((long)&u->sockaddr + 8);
            u->addrs->sockaddr = psVar7;
            u->addrs->socklen = 0x10;
            puVar8 = (u_char *)ngx_pnalloc(pool,(u->host).len + 6);
            if (puVar8 == (u_char *)0x0) {
              pool_local = (ngx_pool_t *)0xffffffffffffffff;
            }
            else {
              puVar4 = ngx_sprintf(puVar8,"%V:%d",&u->host,(ulong)u->port);
              (u->addrs->name).len = (long)puVar4 - (long)puVar8;
              (u->addrs->name).data = puVar8;
              pool_local = (ngx_pool_t *)0x0;
            }
          }
        }
      }
    }
    else {
      (u->sockaddr).sockaddr_in6.sin6_flowinfo = 0;
      u->field_0x48 = u->field_0x48 & 0xef | 0x10;
      pool_local = (ngx_pool_t *)0x0;
    }
  }
  return (ngx_int_t)pool_local;
}

Assistant:

static ngx_int_t
ngx_parse_inet_url(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char               *p, *host, *port, *last, *uri, *args;
    size_t                len;
    ngx_int_t             n;
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin6;
#endif

    u->socklen = sizeof(struct sockaddr_in);
    sin = (struct sockaddr_in *) &u->sockaddr;
    sin->sin_family = AF_INET;

    u->family = AF_INET;

    host = u->url.data;

    last = host + u->url.len;

    port = ngx_strlchr(host, last, ':');

    uri = ngx_strlchr(host, last, '/');

    args = ngx_strlchr(host, last, '?');

    if (args) {
        if (uri == NULL || args < uri) {
            uri = args;
        }
    }

    if (uri) {
        if (u->listen || !u->uri_part) {
            u->err = "invalid host";
            return NGX_ERROR;
        }

        u->uri.len = last - uri;
        u->uri.data = uri;

        last = uri;

        if (uri < port) {
            port = NULL;
        }
    }

    if (port) {
        port++;

        len = last - port;

        n = ngx_atoi(port, len);

        if (n < 1 || n > 65535) {
            u->err = "invalid port";
            return NGX_ERROR;
        }

        u->port = (in_port_t) n;
        sin->sin_port = htons((in_port_t) n);

        u->port_text.len = len;
        u->port_text.data = port;

        last = port - 1;

    } else {
        if (uri == NULL) {

            if (u->listen) {

                /* test value as port only */

                n = ngx_atoi(host, last - host);

                if (n != NGX_ERROR) {

                    if (n < 1 || n > 65535) {
                        u->err = "invalid port";
                        return NGX_ERROR;
                    }

                    u->port = (in_port_t) n;
                    sin->sin_port = htons((in_port_t) n);

                    u->port_text.len = last - host;
                    u->port_text.data = host;

                    u->wildcard = 1;

                    return NGX_OK;
                }
            }
        }

        u->no_port = 1;
        u->port = u->default_port;
        sin->sin_port = htons(u->default_port);
    }

    len = last - host;

    if (len == 0) {
        u->err = "no host";
        return NGX_ERROR;
    }

    u->host.len = len;
    u->host.data = host;

    if (u->listen && len == 1 && *host == '*') {
        sin->sin_addr.s_addr = INADDR_ANY;
        u->wildcard = 1;
        return NGX_OK;
    }

    sin->sin_addr.s_addr = ngx_inet_addr(host, len);

    if (sin->sin_addr.s_addr != INADDR_NONE) {

        if (sin->sin_addr.s_addr == INADDR_ANY) {
            u->wildcard = 1;
        }

        u->naddrs = 1;

        u->addrs = ngx_pcalloc(pool, sizeof(ngx_addr_t));
        if (u->addrs == NULL) {
            return NGX_ERROR;
        }

        sin = ngx_pcalloc(pool, sizeof(struct sockaddr_in));
        if (sin == NULL) {
            return NGX_ERROR;
        }

        ngx_memcpy(sin, &u->sockaddr, sizeof(struct sockaddr_in));

        u->addrs[0].sockaddr = (struct sockaddr *) sin;
        u->addrs[0].socklen = sizeof(struct sockaddr_in);

        p = ngx_pnalloc(pool, u->host.len + sizeof(":65535") - 1);
        if (p == NULL) {
            return NGX_ERROR;
        }

        u->addrs[0].name.len = ngx_sprintf(p, "%V:%d",
                                           &u->host, u->port) - p;
        u->addrs[0].name.data = p;

        return NGX_OK;
    }

    if (u->no_resolve) {
        return NGX_OK;
    }

    if (ngx_inet_resolve_host(pool, u) != NGX_OK) {
        return NGX_ERROR;
    }

    u->family = u->addrs[0].sockaddr->sa_family;
    u->socklen = u->addrs[0].socklen;
    ngx_memcpy(&u->sockaddr, u->addrs[0].sockaddr, u->addrs[0].socklen);

    switch (u->family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) &u->sockaddr;

        if (IN6_IS_ADDR_UNSPECIFIED(&sin6->sin6_addr)) {
            u->wildcard = 1;
        }

        break;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) &u->sockaddr;

        if (sin->sin_addr.s_addr == INADDR_ANY) {
            u->wildcard = 1;
        }

        break;
    }

    return NGX_OK;
}